

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O0

int yaml_emitter_emit_stream_start(yaml_emitter_t *emitter,yaml_event_t *event)

{
  int iVar1;
  int iVar2;
  yaml_event_t *event_local;
  yaml_emitter_t *emitter_local;
  
  if (event->type == YAML_STREAM_START_EVENT) {
    if (emitter->encoding == YAML_ANY_ENCODING) {
      emitter->encoding = (event->data).stream_start.encoding;
    }
    if (emitter->encoding == YAML_ANY_ENCODING) {
      emitter->encoding = YAML_UTF8_ENCODING;
    }
    if ((emitter->best_indent < 2) || (9 < emitter->best_indent)) {
      emitter->best_indent = 2;
    }
    if ((-1 < emitter->best_width) &&
       (iVar1 = emitter->best_width, iVar2 = emitter->best_indent * 2,
       iVar1 == iVar2 || SBORROW4(iVar1,iVar2) != iVar1 + emitter->best_indent * -2 < 0)) {
      emitter->best_width = 0x50;
    }
    if (emitter->best_width < 0) {
      emitter->best_width = 0x7fffffff;
    }
    if (emitter->line_break == YAML_ANY_BREAK) {
      emitter->line_break = YAML_LN_BREAK;
    }
    emitter->indent = -1;
    emitter->line = 0;
    emitter->column = 0;
    emitter->whitespace = 1;
    emitter->indention = 1;
    if ((emitter->encoding == YAML_UTF8_ENCODING) ||
       (iVar1 = yaml_emitter_write_bom(emitter), iVar1 != 0)) {
      emitter->state = YAML_EMIT_FIRST_DOCUMENT_START_STATE;
      emitter_local._4_4_ = 1;
    }
    else {
      emitter_local._4_4_ = 0;
    }
  }
  else {
    emitter_local._4_4_ = yaml_emitter_set_emitter_error(emitter,"expected STREAM-START");
  }
  return emitter_local._4_4_;
}

Assistant:

static int
yaml_emitter_emit_stream_start(yaml_emitter_t *emitter,
        yaml_event_t *event)
{
    if (event->type == YAML_STREAM_START_EVENT)
    {
        if (!emitter->encoding) {
            emitter->encoding = event->data.stream_start.encoding;
        }

        if (!emitter->encoding) {
            emitter->encoding = YAML_UTF8_ENCODING;
        }

        if (emitter->best_indent < 2 || emitter->best_indent > 9) {
            emitter->best_indent  = 2;
        }

        if (emitter->best_width >= 0
                && emitter->best_width <= emitter->best_indent*2) {
            emitter->best_width = 80;
        }

        if (emitter->best_width < 0) {
            emitter->best_width = INT_MAX;
        }

        if (!emitter->line_break) {
            emitter->line_break = YAML_LN_BREAK;
        }

        emitter->indent = -1;

        emitter->line = 0;
        emitter->column = 0;
        emitter->whitespace = 1;
        emitter->indention = 1;

        if (emitter->encoding != YAML_UTF8_ENCODING) {
            if (!yaml_emitter_write_bom(emitter))
                return 0;
        }

        emitter->state = YAML_EMIT_FIRST_DOCUMENT_START_STATE;

        return 1;
    }

    return yaml_emitter_set_emitter_error(emitter,
            "expected STREAM-START");
}